

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

int tree::truncate(char *__file,__off_t __length)

{
  undefined4 uVar1;
  int iVar2;
  int extraout_EAX;
  wchar_t *pwVar3;
  byte_string local_e0;
  int local_bc;
  int local_b8;
  int j;
  int i;
  int rs;
  int ls;
  undefined1 local_a0 [8];
  wstring str;
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  converter;
  int old_bytesize;
  Cell *cell_local;
  int l_local;
  
  converter._92_4_ = std::__cxx11::string::size();
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                     *)&stack0xffffffffffffff80);
  std::__cxx11::string::c_str();
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::from_bytes((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                *)local_a0,(char *)&stack0xffffffffffffff80);
  i = 0;
  j = 0;
  local_b8 = 0;
  local_bc = std::__cxx11::wstring::size();
  local_bc = local_bc + -1;
  while (i + j < (int)__file + -2) {
    if (i < j) {
      pwVar3 = (wchar_t *)std::__cxx11::wstring::at((ulong)local_a0);
      iVar2 = wchar_width(*pwVar3);
      i = iVar2 + i;
      local_b8 = local_b8 + 1;
    }
    else {
      pwVar3 = (wchar_t *)std::__cxx11::wstring::at((ulong)local_a0);
      iVar2 = wchar_width(*pwVar3);
      j = iVar2 + j;
      local_bc = local_bc + -1;
    }
  }
  std::__cxx11::wstring::erase((ulong)local_a0,(long)local_b8);
  std::__cxx11::wstring::insert((ulong)local_a0,(wchar_t *)(long)local_b8);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::to_bytes(&local_e0,
             (wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
              *)&stack0xffffffffffffff80,(wide_string *)local_a0);
  std::__cxx11::string::operator=((string *)(__length + 0x10),(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  uVar1 = converter._92_4_;
  iVar2 = std::__cxx11::string::size();
  *(int *)(__length + 0xc) = *(int *)(__length + 0xc) - (uVar1 - iVar2);
  *(int *)(__length + 4) =
       *(int *)(__length + 4) - ((*(int *)(__length + 4) - *(int *)__length) - (i + j + 1));
  std::__cxx11::wstring::~wstring((wstring *)local_a0);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::~wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                      *)&stack0xffffffffffffff80);
  return extraout_EAX;
}

Assistant:

void truncate(const int l, Cell &cell)
{
    int old_bytesize = cell.text.size();
    std::wstring_convert<std::codecvt_utf8<wchar_t>, wchar_t> converter;
    std::wstring str = converter.from_bytes(cell.text.c_str());
    int ls = 0, rs = 0;
    int i = 0, j = str.size() - 1;
    while (ls + rs < l - 2) {
        if (ls < rs) {
            ls += wchar_width(str.at(i));
            i++;
        } else {
            rs += wchar_width(str.at(j));
            j--;
        }
    }
    str.erase(i, j - i + 1);
    str.insert(i, L"…");
    // https://stackoverflow.com/questions/4804298/how-to-convert-wstring-into-string
    // use converter (.to_bytes: wstr->str, .from_bytes: str->wstr)
    cell.text = converter.to_bytes(str);
    cell.byte_end -= old_bytesize - cell.text.size();
    cell.col_end -= cell.col_end - cell.col_start - (ls + rs + 1);
}